

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_dr_prediction_z1_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  
  bVar4 = (byte)upsample_above;
  iVar1 = bw + bh + -1 << (bVar4 & 0x1f);
  if (0 < bh) {
    lVar10 = (long)iVar1;
    iVar9 = 0;
    iVar6 = dx;
    iVar5 = bh;
    do {
      iVar2 = iVar6 >> (6 - bVar4 & 0x1f);
      if (iVar1 <= iVar2) {
        if (bh <= iVar9) {
          return;
        }
        do {
          memset(dst,(uint)above[lVar10],(long)bw);
          dst = dst + stride;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        return;
      }
      if (0 < bw) {
        uVar8 = (uint)(iVar6 << (bVar4 & 0x1f)) >> 1 & 0x1f;
        lVar3 = (long)iVar2;
        uVar11 = 0;
        do {
          if (lVar3 < lVar10) {
            uVar7 = (uint8_t)((uint)above[lVar3] * (0x20 - uVar8) + above[lVar3 + 1] * uVar8 + 0x10
                             >> 5);
          }
          else {
            uVar7 = above[lVar10];
          }
          dst[uVar11] = uVar7;
          uVar11 = uVar11 + 1;
          lVar3 = lVar3 + (1 << (bVar4 & 0x1f));
        } while ((uint)bw != uVar11);
      }
      iVar9 = iVar9 + 1;
      dst = dst + stride;
      iVar6 = iVar6 + dx;
      iVar5 = iVar5 + -1;
    } while (iVar9 != bh);
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_above, int dx, int dy) {
  int r, c, x, base, shift, val;

  (void)left;
  (void)dy;
  assert(dy == 1);
  assert(dx > 0);

  const int max_base_x = ((bw + bh) - 1) << upsample_above;
  const int frac_bits = 6 - upsample_above;
  const int base_inc = 1 << upsample_above;
  x = dx;
  for (r = 0; r < bh; ++r, dst += stride, x += dx) {
    base = x >> frac_bits;
    shift = ((x << upsample_above) & 0x3F) >> 1;

    if (base >= max_base_x) {
      for (int i = r; i < bh; ++i) {
        memset(dst, above[max_base_x], bw * sizeof(dst[0]));
        dst += stride;
      }
      return;
    }

    for (c = 0; c < bw; ++c, base += base_inc) {
      if (base < max_base_x) {
        val = above[base] * (32 - shift) + above[base + 1] * shift;
        dst[c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        dst[c] = above[max_base_x];
      }
    }
  }
}